

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O2

bool __thiscall Assimp::FileSystemFilter::Exists(FileSystemFilter *this,char *pFile)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_31;
  string tmp;
  
  if (this->mWrapped != (IOSystem *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,pFile,&local_31);
    bVar1 = std::operator!=(&tmp,&this->mSrc_file);
    if (bVar1) {
      BuildPath(this,&tmp);
      Cleanup(this,&tmp);
    }
    iVar2 = (*this->mWrapped->_vptr_IOSystem[2])(this->mWrapped,tmp._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&tmp);
    return SUB41(iVar2,0);
  }
  __assert_fail("nullptr != mWrapped",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/FileSystemFilter.h"
                ,0x67,"virtual bool Assimp::FileSystemFilter::Exists(const char *) const");
}

Assistant:

bool Exists( const char* pFile) const {
        ai_assert( nullptr != mWrapped );
        
        std::string tmp = pFile;

        // Currently this IOSystem is also used to open THE ONE FILE.
        if (tmp != mSrc_file)    {
            BuildPath(tmp);
            Cleanup(tmp);
        }

        return mWrapped->Exists(tmp);
    }